

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codadump-ascii.c
# Opt level: O3

void export_data_element_to_ascii(void)

{
  if (first_write_of_data == '\0') {
    first_write_of_data = '\x01';
  }
  else {
    fputc(10,(FILE *)ascii_output);
  }
  if (show_label != 0) {
    print_full_field_name(ascii_output,2,0);
    fputc(10,(FILE *)ascii_output);
  }
  if ((0 < dim_info.num_dims) && (dim_info.filled_num_elements[dim_info.num_dims - 1] == 0)) {
    return;
  }
  write_data(ascii_output,0,0,0);
  return;
}

Assistant:

void export_data_element_to_ascii(void)
{
    if (first_write_of_data)
    {
        first_write_of_data = 0;
    }
    else
    {
        /* print data separator */
        fprintf(ascii_output, "\n");
    }

    if (show_label)
    {
        print_full_field_name(ascii_output, 2, 0);
        fprintf(ascii_output, "\n");
    }

    if (dim_info.num_dims > 0 && dim_info.filled_num_elements[dim_info.num_dims - 1] == 0)
    {
        /* no data */
        return;
    }

    write_data(ascii_output, 0, 0, 0);
}